

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

bool __thiscall tl::StrT<char>::operator==(StrT<char> *this,CStrT<char> o)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  
  uVar1 = this->_size;
  if (uVar1 == o._size) {
    bVar3 = uVar1 == 0;
    if (!bVar3) {
      lVar2 = 0;
      do {
        if (o._size == (uint)lVar2) {
          __assert_fail("i < _size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.hpp"
                        ,0x20,"CharT tl::CStrT<char>::operator[](u32) const [CharT = char]");
        }
        if (o._str[lVar2] != this->_str[lVar2]) {
          return bVar3;
        }
        lVar2 = lVar2 + 1;
        bVar3 = uVar1 <= (uint)lVar2;
      } while ((uint)lVar2 != uVar1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool StrT<CharT>::operator==(CStrT<CharT> o)const
{
    if(_size != o.size())
        return false;
    for(uint32_t i = 0; i < _size; i++) {
        if(o[i] != _str[i])
            return false;
    }
    return true;
}